

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O3

String * __thiscall
Corrade::Utility::String::lowercase(String *__return_storage_ptr__,String *this,StringView string)

{
  StringView view;
  BasicStringView<char> local_20;
  
  view._sizePlusFlags = string._data;
  view._data = (char *)this;
  Containers::String::String(__return_storage_ptr__,view);
  Containers::BasicStringView<char>::BasicStringView(&local_20,__return_storage_ptr__);
  Implementation::lowercaseInPlace();
  return __return_storage_ptr__;
}

Assistant:

Containers::String lowercase(const Containers::StringView string) {
    /* Theoretically doing the copy in the same loop as case change could be
       faster for *really long* strings due to cache reuse, but until that
       proves to be a bottleneck I'll go with the simpler solution.

       Not implementing through lowercase(Containers::String) as the call stack
       is deep enough already and we don't need the extra checks there. */
    Containers::String out{string};
    lowercaseInPlace(out);
    return out;
}